

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

floatx80 floatx80_mul(floatx80 a,floatx80 b)

{
  floatx80 b_00;
  floatx80 b_01;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 z;
  bits64 zSig1;
  bits64 zSig0;
  bits64 bSig;
  bits64 aSig;
  int32 zExp;
  int32 bExp;
  int32 aExp;
  flag zSign;
  flag bSign;
  flag aSign;
  floatx80 b_local;
  floatx80 a_local;
  bits64 local_10;
  
  a_00.low = a.low;
  b_local._0_8_ = b.low;
  aExp._0_2_ = b.high;
  b_local.low._0_2_ = a.high;
  a_00._2_6_ = 0;
  a_00.high = (ushort)b_local.low;
  bSig = extractFloatx80Frac(a_00);
  a_01._2_6_ = 0;
  a_01.high = (ushort)b_local.low;
  a_01.low = a_00.low;
  zExp = extractFloatx80Exp(a_01);
  a_02._2_6_ = 0;
  a_02.high = (ushort)b_local.low;
  a_02.low = a_00.low;
  bExp._3_1_ = extractFloatx80Sign(a_02);
  a_03._2_6_ = 0;
  a_03.high = (bits16)aExp;
  a_03.low = b_local._0_8_;
  zSig0 = extractFloatx80Frac(a_03);
  a_04._2_6_ = 0;
  a_04.high = (bits16)aExp;
  a_04.low = b_local._0_8_;
  aSig._4_4_ = extractFloatx80Exp(a_04);
  a_05._2_6_ = 0;
  a_05.high = (bits16)aExp;
  a_05.low = b_local._0_8_;
  bExp._2_1_ = extractFloatx80Sign(a_05);
  bExp._1_1_ = bExp._3_1_ ^ bExp._2_1_;
  if (zExp == 0x7fff) {
    if (((bSig & 0x7fffffffffffffff) != 0) ||
       ((aSig._4_4_ == 0x7fff && ((zSig0 & 0x7fffffffffffffff) != 0)))) {
      a_06._2_6_ = 0;
      a_06.high = (ushort)b_local.low;
      b_00._2_6_ = 0;
      b_00.high = (bits16)aExp;
      b_00.low = b_local._0_8_;
      a_06.low = a_00.low;
      fVar1 = propagateFloatx80NaN(a_06,b_00);
      a_local.low._0_2_ = fVar1.high;
      goto LAB_00565b6b;
    }
    if (aSig._4_4_ != 0 || zSig0 != 0) {
      fVar1 = packFloatx80(bExp._1_1_,0x7fff,0x8000000000000000);
      a_local.low._0_2_ = fVar1.high;
      goto LAB_00565b6b;
    }
  }
  else {
    if (aSig._4_4_ != 0x7fff) {
      if (zExp == 0) {
        if (bSig == 0) {
          fVar1 = packFloatx80(bExp._1_1_,0,0);
          a_local.low._0_2_ = fVar1.high;
          goto LAB_00565b6b;
        }
        normalizeFloatx80Subnormal(bSig,&zExp,&bSig);
      }
      if (aSig._4_4_ == 0) {
        if (zSig0 == 0) {
          fVar1 = packFloatx80(bExp._1_1_,0,0);
          a_local.low._0_2_ = fVar1.high;
          goto LAB_00565b6b;
        }
        normalizeFloatx80Subnormal(zSig0,(int32 *)((long)&aSig + 4),&zSig0);
      }
      aSig._0_4_ = zExp + aSig._4_4_ + -0x3ffe;
      mul64To128(bSig,zSig0,&zSig1,&z.low);
      if (0 < (long)zSig1) {
        shortShift128Left(zSig1,z.low,1,&zSig1,&z.low);
        aSig._0_4_ = (int)aSig + -1;
      }
      fVar1 = roundAndPackFloatx80(floatx80_rounding_precision,bExp._1_1_,(int)aSig,zSig1,z.low);
      a_local.low._0_2_ = fVar1.high;
      goto LAB_00565b6b;
    }
    if ((zSig0 & 0x7fffffffffffffff) != 0) {
      a_07._2_6_ = 0;
      a_07.high = (ushort)b_local.low;
      b_01._2_6_ = 0;
      b_01.high = (bits16)aExp;
      b_01.low = b_local._0_8_;
      a_07.low = a_00.low;
      fVar1 = propagateFloatx80NaN(a_07,b_01);
      a_local.low._0_2_ = fVar1.high;
      goto LAB_00565b6b;
    }
    if (zExp != 0 || bSig != 0) {
      fVar1 = packFloatx80(bExp._1_1_,0x7fff,0x8000000000000000);
      a_local.low._0_2_ = fVar1.high;
      goto LAB_00565b6b;
    }
  }
  float_raise('\x01');
  a_local.low._0_2_ = 0xffff;
  fVar1.low = 0xffffffffffffffff;
  fVar1._0_8_ = 0xffffffffffffffff;
LAB_00565b6b:
  local_10 = fVar1.low;
  fVar2._2_6_ = fVar1._2_6_;
  fVar2.high = (bits16)a_local.low;
  fVar2.low = local_10;
  return fVar2;
}

Assistant:

floatx80 floatx80_mul( floatx80 a, floatx80 b )
{
	flag aSign, bSign, zSign;
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	floatx80 z;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	bSign = extractFloatx80Sign( b );
	zSign = aSign ^ bSign;
	if ( aExp == 0x7FFF ) {
		if (    (bits64) ( aSig<<1 )
				|| ( ( bExp == 0x7FFF ) && (bits64) ( bSig<<1 ) ) ) {
			return propagateFloatx80NaN( a, b );
		}
		if ( ( bExp | bSig ) == 0 ) goto invalid;
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( bExp == 0x7FFF ) {
		if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
		if ( ( aExp | aSig ) == 0 ) {
	invalid:
			float_raise( float_flag_invalid );
			z.low = floatx80_default_nan_low;
			z.high = floatx80_default_nan_high;
			return z;
		}
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
	}
	if ( bExp == 0 ) {
		if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
	}
	zExp = aExp + bExp - 0x3FFE;
	mul64To128( aSig, bSig, &zSig0, &zSig1 );
	if ( 0 < (sbits64) zSig0 ) {
		shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
		--zExp;
	}
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}